

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha256_compile(sha256_ctx *ctx)

{
  sha2_32t sVar1;
  sha2_32t sVar2;
  sha2_32t sVar3;
  sha2_32t sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  sha2_32t sVar18;
  sha2_32t sVar19;
  sha2_32t sVar20;
  sha2_32t sVar21;
  sha2_32t sVar22;
  sha2_32t sVar23;
  sha2_32t sVar24;
  int iVar25;
  sha2_32t sVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  
  sVar1 = ctx->hash[0];
  sVar2 = ctx->hash[1];
  sVar3 = ctx->hash[2];
  sVar4 = ctx->hash[3];
  uVar5 = ctx->hash[4];
  uVar6 = ctx->hash[5];
  uVar7 = ctx->hash[6];
  uVar8 = ctx->hash[7];
  sVar19 = sVar4;
  uVar16 = uVar7;
  uVar32 = uVar8;
  uVar28 = uVar6;
  uVar12 = uVar5;
  sVar23 = sVar3;
  sVar26 = sVar2;
  sVar24 = sVar1;
  for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 0x10) {
    if (uVar14 == 0) {
      uVar13 = ctx->wbuf[0];
    }
    else {
      uVar13 = ctx->wbuf[0xe];
      uVar31 = ctx->wbuf[1];
      uVar13 = (uVar13 >> 10 ^ (uVar13 << 0xd | uVar13 >> 0x13) ^ (uVar13 << 0xf | uVar13 >> 0x11))
               + ctx->wbuf[9] + ctx->wbuf[0] +
               (uVar31 >> 3 ^ (uVar31 << 0xe | uVar31 >> 0x12) ^ (uVar31 << 0x19 | uVar31 >> 7));
      ctx->wbuf[0] = uVar13;
    }
    iVar25 = ((uVar28 ^ uVar16) & uVar12 ^ uVar16) + uVar32 +
             ((uVar12 << 7 | uVar12 >> 0x19) ^
             (uVar12 << 0x15 | uVar12 >> 0xb) ^ (uVar12 << 0x1a | uVar12 >> 6)) + uVar13 +
             k256[uVar14];
    if (uVar14 == 0) {
      sVar18 = ctx->wbuf[1];
    }
    else {
      uVar32 = ctx->wbuf[0xf];
      uVar31 = ctx->wbuf[2];
      sVar18 = (uVar32 >> 10 ^ (uVar32 << 0xd | uVar32 >> 0x13) ^ (uVar32 << 0xf | uVar32 >> 0x11))
               + ctx->wbuf[10] + ctx->wbuf[1] +
               (uVar31 >> 3 ^ (uVar31 << 0xe | uVar31 >> 0x12) ^ (uVar31 << 0x19 | uVar31 >> 7));
      ctx->wbuf[1] = sVar18;
    }
    uVar32 = sVar19 + iVar25;
    iVar9 = ((uVar12 ^ uVar28) & uVar32 ^ uVar28) + uVar16 + sVar18 +
            ((uVar32 * 0x80 | uVar32 >> 0x19) ^
            (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
            k256[uVar14 + 1];
    if (uVar14 == 0) {
      sVar19 = ctx->wbuf[2];
    }
    else {
      uVar16 = ctx->wbuf[3];
      sVar19 = (uVar13 >> 10 ^ (uVar13 << 0xd | uVar13 >> 0x13) ^ (uVar13 << 0xf | uVar13 >> 0x11))
               + ctx->wbuf[0xb] + ctx->wbuf[2] +
               (uVar16 >> 3 ^ (uVar16 << 0xe | uVar16 >> 0x12) ^ (uVar16 << 0x19 | uVar16 >> 7));
      ctx->wbuf[2] = sVar19;
    }
    uVar16 = iVar9 + sVar23;
    iVar17 = ((uVar32 ^ uVar12) & uVar16 ^ uVar12) + uVar28 + sVar19 +
             ((uVar16 * 0x80 | uVar16 >> 0x19) ^
             (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
             k256[uVar14 + 2];
    if (uVar14 == 0) {
      sVar20 = ctx->wbuf[3];
    }
    else {
      uVar28 = ctx->wbuf[4];
      sVar20 = (sVar18 >> 10 ^ (sVar18 << 0xd | sVar18 >> 0x13) ^ (sVar18 << 0xf | sVar18 >> 0x11))
               + ctx->wbuf[0xc] + ctx->wbuf[3] +
               (uVar28 >> 3 ^ (uVar28 << 0xe | uVar28 >> 0x12) ^ (uVar28 << 0x19 | uVar28 >> 7));
      ctx->wbuf[3] = sVar20;
    }
    uVar28 = iVar17 + sVar26;
    iVar15 = ((uVar16 ^ uVar32) & uVar28 ^ uVar32) + uVar12 + sVar20 +
             ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
             k256[uVar14 + 3];
    if (uVar14 == 0) {
      sVar21 = ctx->wbuf[4];
    }
    else {
      uVar12 = ctx->wbuf[5];
      sVar21 = (sVar19 >> 10 ^ (sVar19 << 0xd | sVar19 >> 0x13) ^ (sVar19 << 0xf | sVar19 >> 0x11))
               + ctx->wbuf[0xd] + ctx->wbuf[4] +
               (uVar12 >> 3 ^ (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7));
      ctx->wbuf[4] = sVar21;
    }
    uVar12 = iVar15 + sVar24;
    iVar10 = ((uVar28 ^ uVar16) & uVar12 ^ uVar16) + uVar32 + sVar21 +
             ((uVar12 * 0x80 | uVar12 >> 0x19) ^
             (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
             k256[uVar14 + 4];
    if (uVar14 == 0) {
      sVar22 = ctx->wbuf[5];
    }
    else {
      uVar32 = ctx->wbuf[6];
      sVar22 = (sVar20 >> 10 ^ (sVar20 << 0xd | sVar20 >> 0x13) ^ (sVar20 << 0xf | sVar20 >> 0x11))
               + ctx->wbuf[0xe] + ctx->wbuf[5] +
               (uVar32 >> 3 ^ (uVar32 << 0xe | uVar32 >> 0x12) ^ (uVar32 << 0x19 | uVar32 >> 7));
      ctx->wbuf[5] = sVar22;
    }
    uVar31 = (sVar23 & sVar26 ^ (sVar26 ^ sVar23) & sVar24) +
             ((sVar24 << 10 | sVar24 >> 0x16) ^
             (sVar24 << 0x13 | sVar24 >> 0xd) ^ (sVar24 << 0x1e | sVar24 >> 2)) + iVar25;
    uVar32 = iVar10 + uVar31;
    iVar25 = ((uVar12 ^ uVar28) & uVar32 ^ uVar28) + uVar16 + sVar22 +
             ((uVar32 * 0x80 | uVar32 >> 0x19) ^
             (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
             k256[uVar14 + 5];
    if (uVar14 == 0) {
      uVar16 = ctx->wbuf[6];
    }
    else {
      uVar16 = ctx->wbuf[7];
      uVar16 = (sVar21 >> 10 ^ (sVar21 << 0xd | sVar21 >> 0x13) ^ (sVar21 << 0xf | sVar21 >> 0x11))
               + ctx->wbuf[0xf] + ctx->wbuf[6] +
               (uVar16 >> 3 ^ (uVar16 << 0xe | uVar16 >> 0x12) ^ (uVar16 << 0x19 | uVar16 >> 7));
      ctx->wbuf[6] = uVar16;
    }
    uVar27 = ((sVar26 ^ sVar24) & uVar31 ^ sVar24 & sVar26) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar9;
    uVar11 = iVar25 + uVar27;
    iVar9 = ((uVar32 ^ uVar12) & uVar11 ^ uVar12) + uVar28 + uVar16 +
            ((uVar11 * 0x80 | uVar11 >> 0x19) ^
            (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
            k256[uVar14 + 6];
    if (uVar14 == 0) {
      sVar23 = ctx->wbuf[7];
    }
    else {
      uVar28 = ctx->wbuf[8];
      sVar23 = (sVar22 >> 10 ^ (sVar22 << 0xd | sVar22 >> 0x13) ^ (sVar22 << 0xf | sVar22 >> 0x11))
               + uVar13 + ctx->wbuf[7] +
               (uVar28 >> 3 ^ (uVar28 << 0xe | uVar28 >> 0x12) ^ (uVar28 << 0x19 | uVar28 >> 7));
      ctx->wbuf[7] = sVar23;
    }
    uVar29 = ((sVar24 ^ uVar31) & uVar27 ^ uVar31 & sVar24) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar17;
    uVar28 = iVar9 + uVar29;
    iVar17 = ((uVar11 ^ uVar32) & uVar28 ^ uVar32) + uVar12 + sVar23 +
             ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
             k256[uVar14 + 7];
    if (uVar14 == 0) {
      sVar26 = ctx->wbuf[8];
    }
    else {
      uVar12 = ctx->wbuf[9];
      sVar26 = (uVar16 >> 10 ^ (uVar16 << 0xd | uVar16 >> 0x13) ^ (uVar16 << 0xf | uVar16 >> 0x11))
               + sVar18 + ctx->wbuf[8] +
               (uVar12 >> 3 ^ (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7));
      ctx->wbuf[8] = sVar26;
    }
    uVar31 = ((uVar31 ^ uVar27) & uVar29 ^ uVar27 & uVar31) +
             ((uVar29 * 0x400 | uVar29 >> 0x16) ^
             (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar15;
    uVar12 = iVar17 + uVar31;
    iVar15 = ((uVar28 ^ uVar11) & uVar12 ^ uVar11) + uVar32 + sVar26 +
             ((uVar12 * 0x80 | uVar12 >> 0x19) ^
             (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
             k256[uVar14 + 8];
    if (uVar14 == 0) {
      sVar19 = ctx->wbuf[9];
    }
    else {
      uVar32 = ctx->wbuf[10];
      sVar19 = (sVar23 >> 10 ^ (sVar23 << 0xd | sVar23 >> 0x13) ^ (sVar23 << 0xf | sVar23 >> 0x11))
               + sVar19 + ctx->wbuf[9] +
               (uVar32 >> 3 ^ (uVar32 << 0xe | uVar32 >> 0x12) ^ (uVar32 << 0x19 | uVar32 >> 7));
      ctx->wbuf[9] = sVar19;
    }
    uVar27 = ((uVar27 ^ uVar29) & uVar31 ^ uVar29 & uVar27) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar10;
    uVar32 = iVar15 + uVar27;
    iVar10 = ((uVar12 ^ uVar28) & uVar32 ^ uVar28) + uVar11 + sVar19 +
             ((uVar32 * 0x80 | uVar32 >> 0x19) ^
             (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
             k256[uVar14 + 9];
    if (uVar14 == 0) {
      uVar11 = ctx->wbuf[10];
    }
    else {
      uVar11 = ctx->wbuf[0xb];
      uVar11 = (sVar26 >> 10 ^ (sVar26 << 0xd | sVar26 >> 0x13) ^ (sVar26 << 0xf | sVar26 >> 0x11))
               + sVar20 + ctx->wbuf[10] +
               (uVar11 >> 3 ^ (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7));
      ctx->wbuf[10] = uVar11;
    }
    uVar30 = ((uVar29 ^ uVar31) & uVar27 ^ uVar31 & uVar29) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar25;
    uVar29 = iVar10 + uVar30;
    iVar25 = ((uVar32 ^ uVar12) & uVar29 ^ uVar12) + uVar28 + uVar11 +
             ((uVar29 * 0x80 | uVar29 >> 0x19) ^
             (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
             k256[uVar14 + 10];
    if (uVar14 == 0) {
      sVar19 = ctx->wbuf[0xb];
    }
    else {
      uVar28 = ctx->wbuf[0xc];
      sVar19 = (sVar19 >> 10 ^ (sVar19 << 0xd | sVar19 >> 0x13) ^ (sVar19 << 0xf | sVar19 >> 0x11))
               + sVar21 + ctx->wbuf[0xb] +
               (uVar28 >> 3 ^ (uVar28 << 0xe | uVar28 >> 0x12) ^ (uVar28 << 0x19 | uVar28 >> 7));
      ctx->wbuf[0xb] = sVar19;
    }
    uVar31 = ((uVar31 ^ uVar27) & uVar30 ^ uVar27 & uVar31) +
             ((uVar30 * 0x400 | uVar30 >> 0x16) ^
             (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar9;
    uVar28 = iVar25 + uVar31;
    iVar9 = ((uVar29 ^ uVar32) & uVar28 ^ uVar32) + uVar12 + sVar19 +
            ((uVar28 * 0x80 | uVar28 >> 0x19) ^
            (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
            k256[uVar14 + 0xb];
    if (uVar14 == 0) {
      uVar12 = ctx->wbuf[0xc];
    }
    else {
      uVar12 = ctx->wbuf[0xd];
      uVar12 = (uVar11 >> 10 ^ (uVar11 << 0xd | uVar11 >> 0x13) ^ (uVar11 << 0xf | uVar11 >> 0x11))
               + sVar22 + ctx->wbuf[0xc] +
               (uVar12 >> 3 ^ (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7));
      ctx->wbuf[0xc] = uVar12;
    }
    uVar27 = ((uVar27 ^ uVar30) & uVar31 ^ uVar30 & uVar27) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar17;
    uVar11 = iVar9 + uVar27;
    iVar17 = ((uVar28 ^ uVar29) & uVar11 ^ uVar29) + uVar32 + uVar12 +
             ((uVar11 * 0x80 | uVar11 >> 0x19) ^
             (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
             k256[uVar14 + 0xc];
    if (uVar14 == 0) {
      sVar19 = ctx->wbuf[0xd];
    }
    else {
      uVar32 = ctx->wbuf[0xe];
      sVar19 = (sVar19 >> 10 ^ (sVar19 << 0xd | sVar19 >> 0x13) ^ (sVar19 << 0xf | sVar19 >> 0x11))
               + uVar16 + ctx->wbuf[0xd] +
               (uVar32 >> 3 ^ (uVar32 << 0xe | uVar32 >> 0x12) ^ (uVar32 << 0x19 | uVar32 >> 7));
      ctx->wbuf[0xd] = sVar19;
    }
    uVar30 = ((uVar30 ^ uVar31) & uVar27 ^ uVar31 & uVar30) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar15;
    uVar32 = iVar17 + uVar30;
    iVar15 = ((uVar11 ^ uVar28) & uVar32 ^ uVar28) + uVar29 + sVar19 +
             ((uVar32 * 0x80 | uVar32 >> 0x19) ^
             (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
             k256[uVar14 + 0xd];
    if (uVar14 == 0) {
      sVar23 = ctx->wbuf[0xe];
    }
    else {
      uVar16 = ctx->wbuf[0xf];
      sVar23 = (uVar12 >> 10 ^ (uVar12 << 0xd | uVar12 >> 0x13) ^ (uVar12 << 0xf | uVar12 >> 0x11))
               + sVar23 + ctx->wbuf[0xe] +
               (uVar16 >> 3 ^ (uVar16 << 0xe | uVar16 >> 0x12) ^ (uVar16 << 0x19 | uVar16 >> 7));
      ctx->wbuf[0xe] = sVar23;
    }
    uVar31 = ((uVar31 ^ uVar27) & uVar30 ^ uVar27 & uVar31) +
             ((uVar30 * 0x400 | uVar30 >> 0x16) ^
             (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar10;
    uVar16 = iVar15 + uVar31;
    iVar10 = ((uVar32 ^ uVar11) & uVar16 ^ uVar11) + uVar28 + sVar23 +
             ((uVar16 * 0x80 | uVar16 >> 0x19) ^
             (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
             k256[uVar14 + 0xe];
    if (uVar14 == 0) {
      sVar24 = ctx->wbuf[0xf];
    }
    else {
      sVar24 = (sVar19 >> 10 ^ (sVar19 << 0xd | sVar19 >> 0x13) ^ (sVar19 << 0xf | sVar19 >> 0x11))
               + sVar26 + ctx->wbuf[0xf] +
               (uVar13 >> 3 ^ (uVar13 << 0xe | uVar13 >> 0x12) ^ (uVar13 << 0x19 | uVar13 >> 7));
      ctx->wbuf[0xf] = sVar24;
    }
    uVar28 = ((uVar27 ^ uVar30) & uVar31 ^ uVar30 & uVar27) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar25;
    uVar12 = ((uVar30 ^ uVar31) & uVar28 ^ uVar31 & uVar30) +
             ((uVar28 * 0x400 | uVar28 >> 0x16) ^
             (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) + iVar9;
    sVar19 = ((uVar31 ^ uVar28) & uVar12 ^ uVar28 & uVar31) +
             ((uVar12 * 0x400 | uVar12 >> 0x16) ^
             (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar17;
    sVar23 = ((uVar12 ^ uVar28) & sVar19 ^ uVar12 & uVar28) +
             ((sVar19 * 0x400 | sVar19 >> 0x16) ^
             (sVar19 * 0x80000 | sVar19 >> 0xd) ^ (sVar19 * 0x40000000 | sVar19 >> 2)) + iVar15;
    uVar28 = uVar28 + iVar10;
    sVar26 = ((sVar19 ^ uVar12) & sVar23 ^ sVar19 & uVar12) +
             ((sVar23 * 0x400 | sVar23 >> 0x16) ^
             (sVar23 * 0x80000 | sVar23 >> 0xd) ^ (sVar23 * 0x40000000 | sVar23 >> 2)) + iVar10;
    iVar25 = ((uVar16 ^ uVar32) & uVar28 ^ uVar32) + uVar11 + sVar24 +
             ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
             k256[uVar14 + 0xf];
    uVar12 = uVar12 + iVar25;
    sVar24 = ((sVar23 ^ sVar19) & sVar26 ^ sVar23 & sVar19) +
             ((sVar26 * 0x400 | sVar26 >> 0x16) ^
             (sVar26 * 0x80000 | sVar26 >> 0xd) ^ (sVar26 * 0x40000000 | sVar26 >> 2)) + iVar25;
  }
  ctx->hash[0] = sVar24 + sVar1;
  ctx->hash[1] = sVar26 + sVar2;
  ctx->hash[2] = sVar23 + sVar3;
  ctx->hash[3] = sVar19 + sVar4;
  ctx->hash[4] = uVar12 + uVar5;
  ctx->hash[5] = uVar28 + uVar6;
  ctx->hash[6] = uVar16 + uVar7;
  ctx->hash[7] = uVar32 + uVar8;
  return;
}

Assistant:

void sha256_compile(sha256_ctx ctx[1])
{   sha2_32t    v[8], j;

    memcpy(v, ctx->hash, 8 * sizeof(sha2_32t));

    for(j = 0; j < 64; j += 16)
    {
        h2_cycle( 0, j); h2_cycle( 1, j); h2_cycle( 2, j); h2_cycle( 3, j);
        h2_cycle( 4, j); h2_cycle( 5, j); h2_cycle( 6, j); h2_cycle( 7, j);
        h2_cycle( 8, j); h2_cycle( 9, j); h2_cycle(10, j); h2_cycle(11, j);
        h2_cycle(12, j); h2_cycle(13, j); h2_cycle(14, j); h2_cycle(15, j);
    }

    ctx->hash[0] += v[0]; ctx->hash[1] += v[1]; ctx->hash[2] += v[2]; ctx->hash[3] += v[3];
    ctx->hash[4] += v[4]; ctx->hash[5] += v[5]; ctx->hash[6] += v[6]; ctx->hash[7] += v[7];
}